

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::SerializeWithCachedSizes
          (BiDirectionalLSTMLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  uint64 uVar3;
  ActivationParams *pAVar4;
  LSTMWeightParams *value;
  uint local_30;
  uint n_2;
  uint i_2;
  uint n_1;
  uint i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  BiDirectionalLSTMLayerParams *this_local;
  
  uVar3 = inputvectorsize(this);
  if (uVar3 != 0) {
    uVar3 = inputvectorsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar3,output);
  }
  uVar3 = outputvectorsize(this);
  if (uVar3 != 0) {
    uVar3 = outputvectorsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar3,output);
  }
  i_1 = 0;
  uVar2 = activationsforwardlstm_size(this);
  for (; i_1 < uVar2; i_1 = i_1 + 1) {
    pAVar4 = activationsforwardlstm(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteMessage(10,&pAVar4->super_MessageLite,output);
  }
  i_2 = 0;
  uVar2 = activationsbackwardlstm_size(this);
  for (; i_2 < uVar2; i_2 = i_2 + 1) {
    pAVar4 = activationsbackwardlstm(this,i_2);
    google::protobuf::internal::WireFormatLite::WriteMessage(0xb,&pAVar4->super_MessageLite,output);
  }
  bVar1 = has_params(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xf,&this->params_->super_MessageLite,output);
  }
  local_30 = 0;
  uVar2 = weightparams_size(this);
  for (; local_30 < uVar2; local_30 = local_30 + 1) {
    value = weightparams(this,local_30);
    google::protobuf::internal::WireFormatLite::WriteMessage(0x14,&value->super_MessageLite,output);
  }
  return;
}

Assistant:

void BiDirectionalLSTMLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->inputvectorsize(), output);
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->outputvectorsize(), output);
  }

  // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
  for (unsigned int i = 0, n = this->activationsforwardlstm_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, this->activationsforwardlstm(i), output);
  }

  // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
  for (unsigned int i = 0, n = this->activationsbackwardlstm_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      11, this->activationsbackwardlstm(i), output);
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->has_params()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      15, *this->params_, output);
  }

  // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
  for (unsigned int i = 0, n = this->weightparams_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, this->weightparams(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BiDirectionalLSTMLayerParams)
}